

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_remove_without_global(REF_NODE ref_node,REF_INT node)

{
  int local_24;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sorted_node;
  REF_INT location;
  REF_INT node_local;
  REF_NODE ref_node_local;
  
  if (((node < 0) || (ref_node->max <= node)) || (ref_node->global[node] < 0)) {
    ref_node_local._4_4_ = 3;
  }
  else {
    sorted_node = node;
    _location = ref_node;
    ref_node_local._4_4_ =
         ref_sort_search_glob
                   (ref_node->n,ref_node->sorted_global,ref_node->global[node],
                    &ref_private_macro_code_rss);
    if (ref_node_local._4_4_ == 0) {
      for (local_24 = ref_private_macro_code_rss; local_24 < _location->n + -1;
          local_24 = local_24 + 1) {
        _location->sorted_global[local_24] = _location->sorted_global[local_24 + 1];
      }
      for (local_24 = ref_private_macro_code_rss; local_24 < _location->n + -1;
          local_24 = local_24 + 1) {
        _location->sorted_local[local_24] = _location->sorted_local[local_24 + 1];
      }
      _location->global[sorted_node] = (long)_location->blank;
      _location->blank = -2 - sorted_node;
      _location->n = _location->n + -1;
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1d4,
             "ref_node_remove_without_global",(ulong)ref_node_local._4_4_,"find global in sort list"
            );
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_remove_without_global(REF_NODE ref_node,
                                                  REF_INT node) {
  REF_INT location, sorted_node;
  if (!ref_node_valid(ref_node, node)) return REF_INVALID;

  RSS(ref_sort_search_glob(ref_node_n(ref_node), ref_node->sorted_global,
                           ref_node->global[node], &location),
      "find global in sort list");

  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_global[sorted_node] =
        ref_node->sorted_global[sorted_node + 1];
  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_local[sorted_node] =
        ref_node->sorted_local[sorted_node + 1];

  ref_node->global[node] = ref_node->blank;
  ref_node->blank = index2next(node);

  (ref_node->n)--;

  return REF_SUCCESS;
}